

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_xbm.c
# Opt level: O0

gdImagePtr gdImageCreateFromXbm(FILE *fd)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  size_t sVar4;
  gdImagePtr im_00;
  uint local_264;
  undefined1 local_260;
  undefined1 local_25f;
  undefined1 local_25e;
  undefined1 local_25d;
  uint b;
  char h [8];
  int ch;
  int y;
  int x;
  int bit;
  int i;
  int bytes;
  gdImagePtr im;
  int max_bit;
  int fail;
  uint height;
  uint width;
  int value;
  char *type;
  char iname [255];
  char fline [255];
  FILE *fd_local;
  
  fail = 0;
  max_bit = 0;
  bVar1 = false;
  im._4_4_ = 0;
  bit = 0;
  ch = 0;
  h[4] = '\0';
  h[5] = '\0';
  h[6] = '\0';
  h[7] = '\0';
  rewind((FILE *)fd);
  do {
    do {
      while( true ) {
        pcVar3 = fgets(iname + 0xf8,0xff,(FILE *)fd);
        if (pcVar3 == (char *)0x0) goto LAB_0012f296;
        sVar4 = strlen(iname + 0xf8);
        if (sVar4 == 0xfe) {
          return (gdImagePtr)0x0;
        }
        iVar2 = __isoc99_sscanf(iname + 0xf8,"#define %s %d",&type,&height);
        if (iVar2 != 2) break;
        pcVar3 = strrchr((char *)&type,0x5f);
        if (pcVar3 == (char *)0x0) {
          _width = &type;
        }
        else {
          _width = (char **)(pcVar3 + 1);
        }
        iVar2 = strcmp("width",(char *)_width);
        if (iVar2 == 0) {
          fail = height;
        }
        iVar2 = strcmp("height",(char *)_width);
        if (iVar2 == 0) {
          max_bit = height;
        }
      }
      iVar2 = __isoc99_sscanf(iname + 0xf8,"static unsigned char %s = {",&type);
      if ((iVar2 == 1) ||
         (iVar2 = __isoc99_sscanf(iname + 0xf8,"static char %s = {",&type), iVar2 == 1)) {
        im._4_4_ = 0x80;
      }
      else {
        iVar2 = __isoc99_sscanf(iname + 0xf8,"static unsigned short %s = {",&type);
        if ((iVar2 == 1) ||
           (iVar2 = __isoc99_sscanf(iname + 0xf8,"static short %s = {",&type), iVar2 == 1)) {
          im._4_4_ = 0x8000;
        }
      }
    } while (im._4_4_ == 0);
    bit = (fail + 7U >> 3) * max_bit;
    if (bit == 0) {
      return (gdImagePtr)0x0;
    }
    pcVar3 = strrchr((char *)&type,0x5f);
    if (pcVar3 == (char *)0x0) {
      _width = &type;
    }
    else {
      _width = (char **)(pcVar3 + 1);
    }
    iVar2 = strcmp("bits[]",(char *)_width);
  } while (iVar2 != 0);
LAB_0012f296:
  if (((bit != 0) && (im._4_4_ != 0)) &&
     (im_00 = gdImageCreate(fail,max_bit), im_00 != (gdImagePtr)0x0)) {
    gdImageColorAllocate(im_00,0xff,0xff,0xff);
    gdImageColorAllocate(im_00,0,0,0);
    local_25e = 0;
    b._0_1_ = 0;
    for (x = 0; x < bit; x = x + 1) {
      do {
        h._0_4_ = getc((FILE *)fd);
        if (h._0_4_ == -1) {
          bVar1 = true;
          break;
        }
      } while (h._0_4_ != 0x78);
      if (bVar1) break;
      h._0_4_ = getc((FILE *)fd);
      if (h._0_4_ == -1) {
        h[0] = -1;
        h[1] = -1;
        h[2] = -1;
        h[3] = -1;
        break;
      }
      local_260 = (undefined1)h._0_4_;
      h._0_4_ = getc((FILE *)fd);
      if (h._0_4_ == -1) break;
      local_25f = (undefined1)h._0_4_;
      if (im._4_4_ == 0x8000) {
        h._0_4_ = getc((FILE *)fd);
        if (h._0_4_ == -1) {
          h[0] = -1;
          h[1] = -1;
          h[2] = -1;
          h[3] = -1;
          break;
        }
        local_25e = (undefined1)h._0_4_;
        h._0_4_ = getc((FILE *)fd);
        if (h._0_4_ == -1) break;
        local_25d = (undefined1)h._0_4_;
      }
      __isoc99_sscanf(&local_260,"%x",&local_264);
      for (y = 1; y <= im._4_4_; y = y << 1) {
        gdImageSetPixel(im_00,ch,h._4_4_,(uint)((local_264 & y) != 0));
        if (ch + 1 == im_00->sx) {
          ch = 0;
          h._4_4_ = h._4_4_ + 1;
          if (h._4_4_ == im_00->sy) {
            return im_00;
          }
          break;
        }
        ch = ch + 1;
      }
    }
    gd_error("EOF before image was complete");
    gdImageDestroy(im_00);
  }
  return (gdImagePtr)0x0;
}

Assistant:

BGD_DECLARE(gdImagePtr) gdImageCreateFromXbm(FILE * fd)
{
	char fline[MAX_XBM_LINE_SIZE];
	char iname[MAX_XBM_LINE_SIZE];
	char *type;
	int value;
	unsigned int width = 0, height = 0;
	int fail = 0;
	int max_bit = 0;

	gdImagePtr im;
	int bytes = 0, i;
	int bit, x = 0, y = 0;
	int ch;
	char h[8];
	unsigned int b;

	rewind(fd);
	while (fgets(fline, MAX_XBM_LINE_SIZE, fd)) {
		fline[MAX_XBM_LINE_SIZE-1] = '\0';
		if (strlen(fline) == MAX_XBM_LINE_SIZE-1) {
			return 0;
		}
		if (sscanf(fline, "#define %s %d", iname, &value) == 2) {
			if (!(type = strrchr(iname, '_'))) {
				type = iname;
			} else {
				type++;
			}

			if (!strcmp("width", type)) {
				width = (unsigned int) value;
			}
			if (!strcmp("height", type)) {
				height = (unsigned int) value;
			}
		} else {
			if ( sscanf(fline, "static unsigned char %s = {", iname) == 1
			  || sscanf(fline, "static char %s = {", iname) == 1)
			{
				max_bit = 128;
			} else if (sscanf(fline, "static unsigned short %s = {", iname) == 1
					|| sscanf(fline, "static short %s = {", iname) == 1)
			{
				max_bit = 32768;
			}
			if (max_bit) {
                bytes = (width + 7) / 8 * height;
				if (!bytes) {
					return 0;
				}
				if (!(type = strrchr(iname, '_'))) {
					type = iname;
				} else {
					type++;
				}
				if (!strcmp("bits[]", type)) {
					break;
				}
			}
 		}
	}
	if (!bytes || !max_bit) {
		return 0;
	}

	if(!(im = gdImageCreate(width, height))) {
		return 0;
	}
	gdImageColorAllocate(im, 255, 255, 255);
	gdImageColorAllocate(im, 0, 0, 0);
	h[2] = '\0';
	h[4] = '\0';
	for (i = 0; i < bytes; i++) {
		while (1) {
			if ((ch=getc(fd)) == EOF) {
				fail = 1;
				break;
			}
			if (ch == 'x') {
				break;
			}
		}
		if (fail) {
			break;
		}
		/* Get hex value */
		if ((ch=getc(fd)) == EOF) {
			break;
		}
		h[0] = ch;
		if ((ch=getc(fd)) == EOF) {
			break;
		}
		h[1] = ch;
		if (max_bit == 32768) {
			if ((ch=getc(fd)) == EOF) {
				break;
			}
			h[2] = ch;
			if ((ch=getc(fd)) == EOF) {
				break;
			}
			h[3] = ch;
		}
		sscanf(h, "%x", &b);
		for (bit = 1; bit <= max_bit; bit = bit << 1) {
			gdImageSetPixel(im, x++, y, (b & bit) ? 1 : 0);
			if (x == im->sx) {
				x = 0;
				y++;
				if (y == im->sy) {
					return im;
				}
				break;
			}
		}
	}

	gd_error("EOF before image was complete");
	gdImageDestroy(im);
	return 0;
}